

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void a__GLDepthBind(AGLDepthParams depth)

{
  AGLDepthParams *cur;
  AGLDepthParams depth_local;
  
  cur._0_4_ = depth.mode;
  if ((AGLDepthMode)cur != a__gl_state.depth.mode) {
    if ((AGLDepthMode)cur == AGLDM_Disabled) {
      glDisable(0xb71);
    }
    else {
      glEnable(0xb71);
      glDepthMask((AGLDepthMode)cur == AGLDM_TestAndWrite);
    }
    a__gl_state.depth.mode = (AGLDepthMode)cur;
  }
  if ((a__gl_state.depth.mode != AGLDM_Disabled) &&
     (cur._4_4_ = depth.func, cur._4_4_ != a__gl_state.depth.func)) {
    a__gl_state.depth.func = cur._4_4_;
    glDepthFunc();
  }
  return;
}

Assistant:

static void a__GLDepthBind(AGLDepthParams depth) {
	AGLDepthParams *cur = &a__gl_state.depth;
	if (depth.mode != cur->mode) {
		if (depth.mode == AGLDM_Disabled) {
			AGL__CALL(glDisable(GL_DEPTH_TEST));
		} else {
			AGL__CALL(glEnable(GL_DEPTH_TEST));
			AGL__CALL(glDepthMask(depth.mode == AGLDM_TestAndWrite));
		}
		cur->mode = depth.mode;
	}

	if (cur->mode == AGLDM_Disabled)
		return;

	if (depth.func != cur->func)
		AGL__CALL(glDepthFunc(cur->func = depth.func));
}